

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# channel.c
# Opt level: O2

ssize_t libssh2_channel_read_ex(LIBSSH2_CHANNEL *channel,int stream_id,char *buf,size_t buflen)

{
  int iVar1;
  time_t tVar2;
  ssize_t sVar3;
  
  if (channel == (LIBSSH2_CHANNEL *)0x0) {
    return -0x27;
  }
  if ((channel->remote).window_size < buflen) {
    tVar2 = time((time_t *)0x0);
    do {
      iVar1 = _libssh2_channel_receive_window_adjust(channel,(uint32_t)buflen,'\x01',(uint *)0x0);
      if ((iVar1 != -0x25) || (channel->session->api_block_mode == 0)) break;
      iVar1 = _libssh2_wait_socket(channel->session,tVar2);
    } while (iVar1 == 0);
  }
  tVar2 = time((time_t *)0x0);
  do {
    sVar3 = _libssh2_channel_read(channel,stream_id,buf,buflen);
    iVar1 = (int)sVar3;
    if (iVar1 != -0x25) break;
    if (channel->session->api_block_mode == 0) {
      iVar1 = -0x25;
      break;
    }
    iVar1 = _libssh2_wait_socket(channel->session,tVar2);
  } while (iVar1 == 0);
  return (long)iVar1;
}

Assistant:

LIBSSH2_API ssize_t
libssh2_channel_read_ex(LIBSSH2_CHANNEL *channel, int stream_id, char *buf,
                        size_t buflen)
{
    int rc;
    unsigned long recv_window;

    if(!channel)
        return LIBSSH2_ERROR_BAD_USE;

    recv_window = libssh2_channel_window_read_ex(channel, NULL, NULL);

    if(buflen > recv_window) {
        BLOCK_ADJUST(rc, channel->session,
                     _libssh2_channel_receive_window_adjust(channel, buflen,
                                                            1, NULL));
    }

    BLOCK_ADJUST(rc, channel->session,
                 _libssh2_channel_read(channel, stream_id, buf, buflen));
    return rc;
}